

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall helics::TimeCoordinator::localError(TimeCoordinator *this)

{
  bool bVar1;
  size_type sVar2;
  reference this_00;
  ActionMessage *this_01;
  ActionMessage *in_RDI;
  DependencyInfo *dep_1;
  iterator __end3;
  iterator __begin3;
  TimeDependencies *__range3;
  ActionMessage multi;
  DependencyInfo *dep;
  ActionMessage bye;
  ActionMessage *in_stack_fffffffffffffdc8;
  ActionMessage *in_stack_fffffffffffffdd0;
  byte local_221;
  undefined8 in_stack_fffffffffffffde8;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffdf0;
  byte local_201;
  undefined4 in_stack_fffffffffffffe18;
  GlobalFederateId id;
  TimeRepresentation<count_time<9,_long>_> local_1e0;
  ActionMessage *local_1d8;
  DependencyInfo *local_1d0;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_1c8;
  GlobalFederateId *local_1c0;
  BaseType local_fc;
  TimeRepresentation<count_time<9,_long>_> local_f8;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_f0;
  reference local_e8;
  undefined1 local_d0 [8];
  undefined4 local_c8;
  GlobalFederateId local_c0 [42];
  baseType local_18;
  baseType local_10;
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  if (((in_RDI->payload).buffer._M_elems[0x17] & 1) != 0) {
    return;
  }
  local_10 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  *(baseType *)(in_RDI[1].payload.buffer._M_elems + 0x38) = local_10;
  local_18 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
  in_RDI[2].source_id = (GlobalFederateId)(int)local_18;
  in_RDI[2].source_handle = (InterfaceHandle)(int)((ulong)local_18 >> 0x20);
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffdd0);
  if (!bVar1) goto LAB_00553788;
  bVar1 = TimeDependencies::empty((TimeDependencies *)0x55345c);
  if (bVar1) {
    return;
  }
  ActionMessage::ActionMessage(in_stack_fffffffffffffdf0,startingAction);
  local_c8 = *(undefined4 *)((in_RDI->payload).buffer._M_elems + 8);
  sVar2 = TimeDependencies::size((TimeDependencies *)0x553491);
  if (sVar2 == 1) {
    local_f0._M_current =
         (DependencyInfo *)TimeDependencies::begin((TimeDependencies *)in_stack_fffffffffffffdc8);
    this_00 = __gnu_cxx::
              __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
              ::operator*(&local_f0);
    local_e8 = this_00;
    if ((this_00->dependency & 1U) == 0) {
LAB_00553525:
      local_201 = local_e8->dependent;
    }
    else {
      local_f8 = TimeRepresentation<count_time<9,_long>_>::maxVal();
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                        ((TimeRepresentation<count_time<9,_long>_> *)this_00,&local_f8);
      local_201 = 1;
      if (!bVar1) goto LAB_00553525;
    }
    if ((local_201 & 1) != 0) {
      local_c0[0].gid = (local_e8->fedID).gid;
      local_fc = *(BaseType *)((in_RDI->payload).buffer._M_elems + 8);
      bVar1 = GlobalFederateId::operator==(local_c0,(GlobalFederateId)local_fc);
      if (bVar1) {
        (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,local_d0);
      }
      else {
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdc8);
      }
    }
  }
  else {
    ActionMessage::ActionMessage(in_stack_fffffffffffffdf0,startingAction);
    local_1c0 = &in_RDI->source_id;
    local_1c8._M_current =
         (DependencyInfo *)TimeDependencies::begin((TimeDependencies *)in_stack_fffffffffffffdc8);
    local_1d0 = (DependencyInfo *)
                TimeDependencies::end((TimeDependencies *)in_stack_fffffffffffffdc8);
    while (bVar1 = __gnu_cxx::
                   operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_stack_fffffffffffffdd0,
                              (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                               *)in_stack_fffffffffffffdc8), ((bVar1 ^ 0xffU) & 1) != 0) {
      this_01 = (ActionMessage *)
                __gnu_cxx::
                __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                ::operator*(&local_1c8);
      local_1d8 = this_01;
      if (((this_01->payload).buffer._M_elems[0xf] & 1) == 0) {
LAB_00553690:
        local_221 = (local_1d8->payload).buffer._M_elems[0xe];
      }
      else {
        local_1e0 = TimeRepresentation<count_time<9,_long>_>::maxVal();
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)this_01,&local_1e0);
        local_221 = 1;
        in_stack_fffffffffffffdd0 = this_01;
        if (!bVar1) goto LAB_00553690;
      }
      if ((local_221 & 1) != 0) {
        local_c0[0].gid = *(BaseType *)((local_1d8->payload).buffer._M_elems + 8);
        id.gid = *(BaseType *)((in_RDI->payload).buffer._M_elems + 8);
        bVar1 = GlobalFederateId::operator==
                          ((GlobalFederateId *)((local_1d8->payload).buffer._M_elems + 8),id);
        if (bVar1) {
          (**(code **)(*(long *)in_RDI + 0x18))(in_RDI,local_d0);
        }
        else {
          appendMessage((ActionMessage *)CONCAT44(id.gid,in_stack_fffffffffffffe18),in_RDI);
        }
      }
      __gnu_cxx::
      __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
      ::operator++(&local_1c8);
    }
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8);
    ActionMessage::~ActionMessage(in_stack_fffffffffffffdd0);
  }
  ActionMessage::~ActionMessage(in_stack_fffffffffffffdd0);
LAB_00553788:
  (in_RDI->payload).buffer._M_elems[0x17] = 1;
  return;
}

Assistant:

void TimeCoordinator::localError()
{
    if (disconnected) {
        return;
    }
    time_granted = Time::maxVal();
    time_grantBase = Time::maxVal();
    if (sendMessageFunction) {
        if (dependencies.empty()) {
            return;
        }
        ActionMessage bye(CMD_LOCAL_ERROR);

        bye.source_id = mSourceId;
        if (dependencies.size() == 1) {
            auto& dep = *dependencies.begin();
            if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                bye.dest_id = dep.fedID;
                if (bye.dest_id == mSourceId) {
                    processTimeMessage(bye);
                } else {
                    sendMessageFunction(bye);
                }
            }

        } else {
            ActionMessage multi(CMD_MULTI_MESSAGE);
            for (const auto& dep : dependencies) {
                if ((dep.dependency && dep.next < Time::maxVal()) || dep.dependent) {
                    bye.dest_id = dep.fedID;
                    if (dep.fedID == mSourceId) {
                        processTimeMessage(bye);
                    } else {
                        appendMessage(multi, bye);
                    }
                }
            }
            sendMessageFunction(multi);
        }
    }
    disconnected = true;
}